

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_print_glsl_visitor.cpp
# Opt level: O3

void __thiscall ir_print_glsl_visitor::visit(ir_print_glsl_visitor *this,ir_if *ir)

{
  bool bVar1;
  int iVar2;
  exec_node *peVar3;
  
  string_buffer::asprintf_append(this->buffer,"if (");
  (*(ir->condition->super_ir_instruction)._vptr_ir_instruction[2])(ir->condition,this);
  string_buffer::asprintf_append(this->buffer,") {\n");
  iVar2 = this->indentation;
  this->indentation = iVar2 + 1;
  this->previous_skipped = false;
  peVar3 = (ir->then_instructions).head_sentinel.next;
  if (peVar3->next != (exec_node *)0x0) {
    do {
      indent(this);
      (*(code *)peVar3[-1].prev[1].next)(&peVar3[-1].prev,this);
      bVar1 = this->skipped_this_ir;
      if (bVar1 == false) {
        string_buffer::asprintf_append(this->buffer,";\n");
        bVar1 = this->skipped_this_ir;
      }
      this->previous_skipped = bVar1;
      this->skipped_this_ir = false;
      peVar3 = peVar3->next;
    } while (peVar3->next != (exec_node *)0x0);
    iVar2 = this->indentation + -1;
  }
  this->indentation = iVar2;
  indent(this);
  string_buffer::asprintf_append(this->buffer,"}");
  if ((ir->else_instructions).head_sentinel.next == &(ir->else_instructions).tail_sentinel) {
    return;
  }
  string_buffer::asprintf_append(this->buffer," else {\n");
  iVar2 = this->indentation;
  this->indentation = iVar2 + 1;
  this->previous_skipped = false;
  peVar3 = (ir->else_instructions).head_sentinel.next;
  if (peVar3->next != (exec_node *)0x0) {
    do {
      indent(this);
      (*(code *)peVar3[-1].prev[1].next)(&peVar3[-1].prev,this);
      bVar1 = this->skipped_this_ir;
      if (bVar1 == false) {
        string_buffer::asprintf_append(this->buffer,";\n");
        bVar1 = this->skipped_this_ir;
      }
      this->previous_skipped = bVar1;
      this->skipped_this_ir = false;
      peVar3 = peVar3->next;
    } while (peVar3->next != (exec_node *)0x0);
    iVar2 = this->indentation + -1;
  }
  this->indentation = iVar2;
  indent(this);
  string_buffer::asprintf_append(this->buffer,"}");
  return;
}

Assistant:

void
ir_print_glsl_visitor::visit(ir_if *ir)
{
   buffer.asprintf_append ("if (");
   ir->condition->accept(this);

   buffer.asprintf_append (") {\n");
	indentation++; previous_skipped = false;


   foreach_in_list(ir_instruction, inst, &ir->then_instructions) {
      indent();
      inst->accept(this);
	   end_statement_line();
   }

   indentation--;
   indent();
   buffer.asprintf_append ("}");

   if (!ir->else_instructions.is_empty())
   {
	   buffer.asprintf_append (" else {\n");
	   indentation++; previous_skipped = false;

	   foreach_in_list(ir_instruction, inst, &ir->else_instructions) {
		  indent();
		  inst->accept(this);
		   end_statement_line();
	   }
	   indentation--;
	   indent();
	   buffer.asprintf_append ("}");
   }
}